

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

Record * __thiscall Record::Finds_abi_cxx11_(Record *this,int c)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *this_00;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar4;
  allocator local_21;
  int local_20;
  int local_1c;
  int i;
  int c_local;
  Record *this_local;
  
  lVar4 = CONCAT44(in_register_00000034,c);
  local_20 = 0;
  local_1c = in_EDX;
  _i = lVar4;
  this_local = this;
  while ((uVar1 = (ulong)local_20,
         sVar2 = std::vector<Keys,_std::allocator<Keys>_>::size
                           ((vector<Keys,_std::allocator<Keys>_> *)(lVar4 + 0x40)), uVar1 < sVar2 &&
         (pvVar3 = std::vector<Keys,_std::allocator<Keys>_>::operator[]
                             ((vector<Keys,_std::allocator<Keys>_> *)(lVar4 + 0x40),(long)local_20),
         pvVar3->Column != local_1c))) {
    local_20 = local_20 + 1;
  }
  uVar1 = (ulong)local_20;
  sVar2 = std::vector<Keys,_std::allocator<Keys>_>::size
                    ((vector<Keys,_std::allocator<Keys>_> *)(lVar4 + 0x40));
  if (uVar1 < sVar2) {
    pvVar3 = std::vector<Keys,_std::allocator<Keys>_>::operator[]
                       ((vector<Keys,_std::allocator<Keys>_> *)(lVar4 + 0x40),(long)local_20);
    std::__cxx11::string::string((string *)this,(string *)&pvVar3->Value);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Cannot Find this Column!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return this;
}

Assistant:

string Record::Finds(int c) {
	int i;
	for (i = 0; i < KS.size(); i++) {
		if (KS[i].Column == c)break;
	}
	if (i < KS.size())
		return KS[i].Value;
	else {
		cout << "Cannot Find this Column!" << endl;
		return "";
	}
}